

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

string * __thiscall
OpenMD::Stats::getStatsReport_abi_cxx11_(string *__return_storage_ptr__,Stats *this)

{
  double *pdVar1;
  size_t sVar2;
  pointer pSVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  long lVar6;
  char cVar7;
  string *psVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  ostream *poVar12;
  long lVar13;
  MatrixAccumulator *this_00;
  VectorAccumulator *this_01;
  PotVecAccumulator *this_02;
  long lVar14;
  char *pcVar15;
  uint j;
  long lVar16;
  Stats *this_03;
  RealType RVar17;
  double dVar18;
  Mat3x3d s;
  string rlc;
  string rex;
  string ruc;
  string llc;
  string lex;
  string luc;
  string pm;
  string head;
  Mat3x3d e;
  stringstream report;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  Mat3x3d local_388;
  Stats *local_340;
  long *local_338;
  long local_330;
  long local_328 [2];
  long *local_318;
  long local_310;
  long local_308 [2];
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288 [2];
  long *local_278;
  long local_270;
  long local_268 [2];
  long *local_258;
  long local_250;
  long local_248 [2];
  ResultType local_238;
  stringstream local_1f0 [16];
  long local_1e0 [2];
  undefined8 uStack_1d0;
  uint auStack_1c8 [22];
  ios_base local_170 [264];
  undefined1 local_68 [24];
  string *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_340 = this;
  std::__cxx11::stringstream::stringstream(local_1f0);
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,anon_var_dwarf_8f0595,anon_var_dwarf_8f0595 + 6);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_298,anon_var_dwarf_8f05a1,anon_var_dwarf_8f05a1 + 3);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,anon_var_dwarf_8f05ad,anon_var_dwarf_8f05ad + 3);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,anon_var_dwarf_8f05b9,anon_var_dwarf_8f05b9 + 3);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,anon_var_dwarf_8f05c5,anon_var_dwarf_8f05c5 + 3);
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_318,anon_var_dwarf_8f05d1,anon_var_dwarf_8f05d1 + 3);
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,anon_var_dwarf_8f05dd,anon_var_dwarf_8f05dd + 3);
  plVar11 = (long *)__dynamic_cast(((local_340->data_).
                                    super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->accumulator,
                                   &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  iVar9 = (**(code **)(*plVar11 + 8))(plVar11);
  local_258 = local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'O');
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,(char *)local_258,local_250);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# Status Report:",0x10);
  pdVar1 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
  local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)pdVar1;
  std::__cxx11::string::_M_construct((ulong)&local_388,'>');
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,
                       (char *)local_388.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0],
                       (long)local_388.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"#",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  if ((double *)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar1) {
    operator_delete((void *)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0],
                    (long)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
  *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
       *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Total Time:",0xb);
  *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
  lVar13 = __dynamic_cast(((local_340->data_).
                           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->accumulator,
                          &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  std::ostream::_M_insert<double>(*(double *)(lVar13 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," ",1);
  *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x11;
  *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
       *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x20;
  pSVar3 = (local_340->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (pSVar3->units)._M_dataplus._M_p;
  local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)pdVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,pcVar4,pcVar4 + (pSVar3->units)._M_string_length);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,
                       (char *)local_388.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0],
                       (long)local_388.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"                      #",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  if ((double *)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar1) {
    operator_delete((void *)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[0][0],
                    (long)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
  *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
       *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Number of Samples:",0x12)
  ;
  *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
  std::ostream::operator<<((ostream *)local_1e0,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e0,"                                        #",0x29);
  cVar7 = (char)(ostream *)local_1e0;
  std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  lVar13 = 0;
  this_03 = local_340;
  local_50 = __return_storage_ptr__;
  do {
    iVar9 = (int)lVar13;
    if ((lVar13 != 0) &&
       ((1L << ((byte)lVar13 & 0x3f) & (this_03->statsMask_).super__Base_bitset<1UL>._M_w) != 0)) {
      pSVar3 = (this_03->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar1 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2
      ;
      pcVar4 = pSVar3[lVar13].dataType._M_dataplus._M_p;
      local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           (double)pdVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].dataType._M_string_length);
      iVar10 = std::__cxx11::string::compare((char *)&local_388);
      if ((double *)
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
          pdVar1) {
        operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0],
                        (long)local_388.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
      }
      if (iVar10 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
        *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
             *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
        *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x17;
        pSVar3 = (this_03->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             (double)(local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + 2);
        _Var5._M_p = pSVar3[lVar13].title._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_388,_Var5._M_p,
                   _Var5._M_p + pSVar3[lVar13].title._M_string_length);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,
                             (char *)local_388.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0],
                             (long)local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
        if ((double *)
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2) {
          operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0],
                          (long)local_388.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
        }
        *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
             *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
        *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
        lVar16 = __dynamic_cast((this_03->data_).
                                super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar13].accumulator,
                                &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
        std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x18));
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,(char *)local_278,local_270);
        lVar16 = *(long *)poVar12;
        lVar14 = *(long *)(lVar16 + -0x18);
        *(uint *)(poVar12 + lVar14 + 0x18) = *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
        RVar17 = getRealError(this_03,iVar9);
        std::ostream::_M_insert<double>(RVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," ",1);
        *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
             *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x20;
        *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x11;
        pSVar3 = (this_03->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             (double)(local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + 2);
        pcVar4 = pSVar3[lVar13].units._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].units._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,
                   (char *)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][0],
                   (long)local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][1]);
        if ((double *)
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2) {
          operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0],
                          (long)local_388.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"     #",6);
        std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      else {
        pSVar3 = (this_03->data_).
                 super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
                 2;
        pcVar4 = pSVar3[lVar13].dataType._M_dataplus._M_p;
        local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             (double)pdVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].dataType._M_string_length);
        iVar10 = std::__cxx11::string::compare((char *)&local_388);
        if ((double *)
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] !=
            pdVar1) {
          operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0],
                          (long)local_388.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
        }
        if (iVar10 == 0) {
          getVectorAverage((Vector3d *)&local_238,this_03,iVar9);
          this_01 = (VectorAccumulator *)
                    __dynamic_cast((this_03->data_).
                                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar13].accumulator,
                                   &BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo,0);
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0
          ;
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0
          ;
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0
          ;
          VectorAccumulator::getStdDev(this_01,(ResultType *)&local_388);
          local_38 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0][0] * 1.96;
          sVar2 = (this_01->super_BaseAccumulator).Count_;
          dVar18 = (double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25;
          local_68._8_4_ = SUB84(dVar18,0);
          local_68._0_8_ = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
          local_68._12_4_ = (int)((ulong)dVar18 >> 0x20);
          local_40 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0][1] * 1.96;
          local_48 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0][2] * 1.96;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e0,"#                         ",0x1a);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_298,local_290);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          poVar12 = std::ostream::_M_insert<double>
                              (local_238.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0]);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_2f8,local_2f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"     ",5);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_298,local_290);
          dVar18 = (double)local_68._8_8_ + (double)local_68._0_8_;
          local_68._0_8_ = SQRT(dVar18);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(local_38 / SQRT(dVar18));
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_2f8,local_2f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"                   #",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
          *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
               *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
          *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x17;
          pSVar3 = (this_03->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               (double)(local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + 2);
          _Var5._M_p = pSVar3[lVar13].title._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,_Var5._M_p,
                     _Var5._M_p + pSVar3[lVar13].title._M_string_length);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,
                               (char *)local_388.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_[0][0],
                               (long)local_388.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          if ((double *)
              local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
              != local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
                 2) {
            operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0],
                            (long)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_2b8,local_2b0);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          poVar12 = std::ostream::_M_insert<double>
                              (local_238.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_318,local_310);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_278,local_270);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_2b8,local_2b0);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          poVar12 = std::ostream::_M_insert<double>(local_40 / (double)local_68._0_8_);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_318,local_310);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
               *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x11;
          pSVar3 = (this_03->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               (double)(local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + 2);
          pcVar4 = pSVar3[lVar13].units._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].units._M_string_length);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,
                               (char *)local_388.super_SquareMatrix<double,_3>.
                                       super_RectMatrix<double,_3U,_3U>.data_[0][0],
                               (long)local_388.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," #",2);
          if ((double *)
              local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
              != local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
                 2) {
            operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0],
                            (long)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
          }
          std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e0,"#                         ",0x1a);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_2d8,local_2d0);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          poVar12 = std::ostream::_M_insert<double>
                              (local_238.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][2]);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_338,local_330);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"     ",5);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_2d8,local_2d0);
          lVar16 = *(long *)poVar12;
          lVar14 = *(long *)(lVar16 + -0x18);
          *(uint *)(poVar12 + lVar14 + 0x18) =
               *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(local_48 / (double)local_68._0_8_);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e0,(char *)local_338,local_330);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"                   #",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        else {
          pSVar3 = (this_03->data_).
                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   + 2;
          pcVar4 = pSVar3[lVar13].dataType._M_dataplus._M_p;
          local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
               (double)pdVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].dataType._M_string_length);
          iVar10 = std::__cxx11::string::compare((char *)&local_388);
          if ((double *)
              local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
              != pdVar1) {
            operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0],
                            (long)local_388.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
          }
          if (iVar10 == 0) {
            getPotVecAverage((potVec *)&local_388,this_03,iVar9);
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
                 0.0;
            local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
                 0.0;
            this_02 = (PotVecAccumulator *)
                      __dynamic_cast((this_03->data_).
                                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar13].accumulator,
                                     &BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
            PotVecAccumulator::get95percentConfidenceInterval(this_02,(ResultType *)&local_238);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
            *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                 *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f | 0x80;
            *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x17;
            pSVar3 = (this_03->data_).
                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_3a8 = local_398;
            _Var5._M_p = pSVar3[lVar13].title._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3a8,_Var5._M_p,
                       _Var5._M_p + pSVar3[lVar13].title._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,(char *)local_3a8,local_3a0);
            if (local_3a8 != local_398) {
              operator_delete(local_3a8,local_398[0] + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,":                                                    #"
                       ,0x36);
            std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
            lVar16 = 1;
            do {
              switch((int)lVar16) {
              case 1:
                lVar14 = 0xe;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
                pcVar15 = "van der Waals:";
                break;
              case 2:
                lVar14 = 0xe;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
                pcVar15 = "Electrostatic:";
                break;
              default:
                lVar14 = 8;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
                pcVar15 = "Unknown:";
                break;
              case 5:
                lVar14 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
                pcVar15 = "Hydrogen Bonding:";
                break;
              case 6:
                lVar14 = 0x15;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
                pcVar15 = "Bonded (1-2,1-3,1-4):";
              }
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x18;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,pcVar15,lVar14);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              std::ostream::_M_insert<double>
                        (local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][lVar16]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_278,local_270);
              lVar14 = *(long *)poVar12;
              lVar6 = *(long *)(lVar14 + -0x18);
              *(uint *)(poVar12 + lVar6 + 0x18) =
                   *(uint *)(poVar12 + lVar6 + 0x18) & 0xffffff4f | 0x20;
              *(undefined8 *)(poVar12 + *(long *)(lVar14 + -0x18) + 0x10) = 0xc;
              std::ostream::_M_insert<double>
                        (local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_[0][lVar16]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x20;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x11;
              pSVar3 = (local_340->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_3a8 = local_398;
              pcVar4 = pSVar3[lVar13].units._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a8,pcVar4,pcVar4 + pSVar3[lVar13].units._M_string_length)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_3a8,local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"     #",6);
              if (local_3a8 != local_398) {
                operator_delete(local_3a8,local_398[0] + 1);
              }
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              lVar16 = lVar16 + 1;
              this_03 = local_340;
            } while (lVar16 != 7);
          }
          else {
            pSVar3 = (this_03->data_).
                     super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar1 = local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + 2;
            pcVar4 = pSVar3[lVar13].dataType._M_dataplus._M_p;
            local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                 (double)pdVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_388,pcVar4,pcVar4 + pSVar3[lVar13].dataType._M_string_length
                      );
            iVar10 = std::__cxx11::string::compare((char *)&local_388);
            if ((double *)
                local_388.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
                != pdVar1) {
              operator_delete((void *)local_388.super_SquareMatrix<double,_3>.
                                      super_RectMatrix<double,_3U,_3U>.data_[0][0],
                              (long)local_388.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][2] + 1);
            }
            if (iVar10 == 0) {
              getMatrixAverage(&local_388,this_03,iVar9);
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
                   0.0;
              local_238.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
                   0.0;
              this_00 = (MatrixAccumulator *)
                        __dynamic_cast((this_03->data_).
                                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar13].accumulator
                                       ,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo,0);
              MatrixAccumulator::get95percentConfidenceInterval(this_00,&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,"#                         ",0x1a);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_298,local_290);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_2f8,local_2f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"            #",0xd);
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"# ",2);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0x17;
              pSVar3 = (this_03->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_3a8 = local_398;
              _Var5._M_p = pSVar3[lVar13].title._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a8,_Var5._M_p,
                         _Var5._M_p + pSVar3[lVar13].title._M_string_length);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_3a8,local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
              if (local_3a8 != local_398) {
                operator_delete(local_3a8,local_398[0] + 1);
              }
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_2b8,local_2b0);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_318,local_310);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x20;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xb;
              pSVar3 = (this_03->data_).
                       super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_3a8 = local_398;
              pcVar4 = pSVar3[lVar13].units._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3a8,pcVar4,pcVar4 + pSVar3[lVar13].units._M_string_length)
              ;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_3a8,local_3a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"#",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              if (local_3a8 != local_398) {
                operator_delete(local_3a8,local_398[0] + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,"#                         ",0x1a);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_2d8,local_2d0);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_388.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_338,local_330);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"            #",0xd);
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,"#                                 ",0x22);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_298,local_290);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_2f8,local_2f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,"#                            ",0x1d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,(char *)local_278,local_270);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_2b8,local_2b0);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[1][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_318,local_310);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e0,"#                                 ",0x22);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e0,(char *)local_2d8,local_2d0);
              lVar16 = *(long *)poVar12;
              lVar14 = *(long *)(lVar16 + -0x18);
              *(uint *)(poVar12 + lVar14 + 0x18) =
                   *(uint *)(poVar12 + lVar14 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar12 + *(long *)(lVar16 + -0x18) + 0x10) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][0]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) =
                   *(uint *)((long)auStack_1c8 + *(long *)(local_1e0[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_1d0 + *(long *)(local_1e0[0] + -0x18)) = 0xc;
              poVar12 = std::ostream::_M_insert<double>
                                  (local_238.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[2][2]);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(char *)local_338,local_330);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    #",5);
              std::ios::widen((char)*(undefined8 *)(local_1e0[0] + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
            }
          }
        }
      }
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x2e);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,(char *)local_258,local_250);
  psVar8 = local_50;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::ios_base::~ios_base(local_170);
  return psVar8;
}

Assistant:

std::string Stats::getStatsReport() {
    std::stringstream report;
#if defined(_MSC_VER)
    std::string pm  = " +/- ";
    std::string luc = "[";
    std::string lex = "|";
    std::string llc = "[";
    std::string ruc = "]";
    std::string rex = "|";
    std::string rlc = "]";
#else
    std::string pm  = "  \u00B1  ";
    std::string luc = "\u23A1";
    std::string lex = "\u23A2";
    std::string llc = "\u23A3";
    std::string ruc = "\u23A4";
    std::string rex = "\u23A5";
    std::string rlc = "\u23A6";
#endif

    int nSamp = dynamic_cast<Accumulator*>(data_[TIME].accumulator)->count();

    std::string head(79, '#');
    report << head << std::endl;
    report << "# Status Report:" << std::string(62, ' ') << "#" << std::endl;
    report << "# " << right << setw(24) << "Total Time:";
    report << setw(12) << getRealData(TIME);
    report << " " << setw(17) << left << getUnits(TIME)
           << "                      #" << std::endl;
    report << "# " << right << setw(24) << "Number of Samples:";
    report << setw(12) << nSamp;
    report << "                                        #" << std::endl;

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i] && i != TIME) {
        if (getDataType(i) == "RealType") {
          report << "# " << right << setw(23) << getTitle(i) << ":";
          report << right << setw(12) << getRealAverage(i);
          report << pm << left << setw(12) << getRealError(i);
          report << " " << left << setw(17) << getUnits(i);
          report << "     #" << std::endl;

        } else if (getDataType(i) == "Vector3d") {
          Vector3d s = getVectorAverage(i);
          Vector3d e = getVectorError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0) << ruc << "     ";
          report << luc << right << setw(12) << e(0);
          report << ruc << "                   #" << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1) << rex << pm;
          report << lex << right << setw(12) << e(1) << rex << " ";
          report << left << setw(17) << getUnits(i) << " #";
          report << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2) << rlc << "     ";
          report << llc << right << setw(12) << e(2);
          report << rlc << "                   #" << std::endl;

        } else if (getDataType(i) == "potVec") {
          potVec s = getPotVecAverage(i);
          potVec e = getPotVecError(i);

          report << "# " << right << setw(23) << getTitle(i);
          report << ":                                                    #";
          report << std::endl;

          for (unsigned int j = 1; j < N_INTERACTION_FAMILIES; j++) {
            switch (j) {
            case VANDERWAALS_FAMILY:
              report << "# " << right << setw(24) << "van der Waals:";
              break;
            case ELECTROSTATIC_FAMILY:
              report << "# " << right << setw(24) << "Electrostatic:";
              break;
            case METALLIC_EMBEDDING:
              report << "# " << right << setw(24) << "Metallic Embedding:";
              break;
            case METALLIC_PAIR:
              report << "# " << right << setw(24) << "Metallic Pair:";
              break;
            case HYDROGENBONDING_FAMILY:
              report << "# " << right << setw(24) << "Hydrogen Bonding:";
              break;
            case BONDED_FAMILY:
              report << "# " << right << setw(24) << "Bonded (1-2,1-3,1-4):";
              break;
            default:
              report << "# " << right << setw(24) << "Unknown:";
              break;
            }
            report << right << setw(12) << s[j];
            report << pm << left << setw(12) << e[j];
            report << " " << left << setw(17) << getUnits(i) << "     #";
            report << std::endl;
          }

        } else if (getDataType(i) == "Mat3x3d") {
          Mat3x3d s = getMatrixAverage(i);
          Mat3x3d e = getMatrixError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0, 0) << " ";
          report << right << setw(12) << s(0, 1) << " ";
          report << right << setw(12) << s(0, 2) << ruc << "            #";
          report << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1, 0) << " ";
          report << right << setw(12) << s(1, 1) << " ";
          report << right << setw(12) << s(1, 2) << rex << " ";
          report << left << setw(11) << getUnits(i) << "#" << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2, 0) << " ";
          report << right << setw(12) << s(2, 1) << " ";
          report << right << setw(12) << s(2, 2) << rlc << "            #";
          report << std::endl;

          report << "#                                 ";
          report << luc << right << setw(12) << e(0, 0) << " ";
          report << right << setw(12) << e(0, 1) << " ";
          report << right << setw(12) << e(0, 2) << ruc << "    #";
          report << std::endl;

          report << "#                            " << pm;

          report << lex << right << setw(12) << e(1, 0) << " ";
          report << right << setw(12) << e(1, 1) << " ";
          report << right << setw(12) << e(1, 2) << rex << "    #";
          report << std::endl;

          report << "#                                 ";
          report << llc << right << setw(12) << e(2, 0) << " ";
          report << right << setw(12) << e(2, 1) << " ";
          report << right << setw(12) << e(2, 2) << rlc << "    #";
          report << std::endl;
        }
      }
    }
    report << head << std::endl;

    return report.str();
  }